

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test::
~SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test
          (SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test *this)

{
  StrictMock<solitaire::archivers::SnapshotMock> *pSVar1;
  
  (this->super_SolitaireEmptyHandTest).super_SolitaireTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SolitaireEmptyHandTest_00322558;
  if (((this->super_SolitaireEmptyHandTest).snapshotMock.isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireEmptyHandTest).snapshotMock.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  SolitaireTest::~SolitaireTest((SolitaireTest *)this);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryUncoverTableauPileTopCard) {
    InSequence seq;
    EXPECT_CALL(lastTableauPileMock, isTopCardCovered()).WillOnce(Return(true));
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryUncoverTopCard());
    EXPECT_CALL(*historyTrackerMock, save(Pointer(snapshotMock.get())));

    solitaire.tryUncoverTableauPileTopCard(lastTableauPileId);
}